

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  IntegerTypeSyntax *pIVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::VariableDimensionSyntax>(in_stack_00000070,in_stack_00000068);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::IntegerTypeSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
                     (unaff_retaddr,(SyntaxKind *)__fn,(Token *)__child_stack,(Token *)TVar2.info,
                      TVar2._0_8_);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const IntegerTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<IntegerTypeSyntax>(
        node.kind,
        node.keyword.deepClone(alloc),
        node.signing.deepClone(alloc),
        *deepClone(node.dimensions, alloc)
    );
}